

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

char * fs_read_str(char *name)

{
  IOHANDLE pIVar1;
  char *result;
  IOHANDLE file;
  IOHANDLE in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  undefined8 local_8;
  
  pIVar1 = io_open(in_stack_ffffffffffffffe8,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  if (pIVar1 == (IOHANDLE)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    local_8 = io_read_all_str(in_stack_ffffffffffffffe0);
    io_close((IOHANDLE)0x2573fd);
  }
  return local_8;
}

Assistant:

char *fs_read_str(const char *name)
{
	IOHANDLE file = io_open(name, IOFLAG_READ | IOFLAG_SKIP_BOM);
	char *result;
	if(!file)
	{
		return 0;
	}
	result = io_read_all_str(file);
	io_close(file);
	return result;
}